

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataViewDefault.cpp
# Opt level: O1

bool __thiscall Rml::DataViewChecked::Update(DataViewChecked *this,DataModel *model)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  code *pcVar2;
  size_type sVar3;
  bool bVar4;
  int iVar5;
  Element *element;
  byte bVar6;
  byte bVar7;
  String value;
  Variant variant;
  DataExpressionInterface expr_interface;
  String local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  String local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  Variant local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  DataExpressionInterface local_48;
  
  Variant::Variant(&local_90);
  element = DataView::GetElement((DataView *)this);
  DataExpressionInterface::DataExpressionInterface(&local_48,model,element,(Event *)0x0);
  if (element != (Element *)0x0) {
    if ((this->super_DataViewCommon).expression._M_t.
        super___uniq_ptr_impl<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_>._M_t.
        super__Tuple_impl<0UL,_Rml::DataExpression_*,_std::default_delete<Rml::DataExpression>_>.
        super__Head_base<0UL,_Rml::DataExpression_*,_false>._M_head_impl == (DataExpression *)0x0) {
      bVar4 = Assert("RMLUI_ASSERT(expression)",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DataViewDefault.cpp"
                     ,0x4f);
      if (!bVar4) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
    }
    bVar4 = DataExpression::Run((this->super_DataViewCommon).expression._M_t.
                                super___uniq_ptr_impl<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_Rml::DataExpression_*,_std::default_delete<Rml::DataExpression>_>
                                .super__Head_base<0UL,_Rml::DataExpression_*,_false>._M_head_impl,
                                &local_48,&local_90);
    if (bVar4) {
      if (local_90.type == BOOL) {
        local_130._M_dataplus._M_p = local_130._M_dataplus._M_p & 0xffffffffffffff00;
        Variant::GetInto<bool,_0>(&local_90,(bool *)&local_130);
        bVar7 = (byte)local_130._M_dataplus._M_p;
      }
      else {
        paVar1 = &local_110.field_2;
        local_110._M_string_length = 0;
        local_110.field_2._M_allocated_capacity._0_4_ =
             local_110.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
        local_110._M_dataplus._M_p = (pointer)paVar1;
        Variant::
        GetInto<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (&local_90,&local_110);
        sVar3 = local_110._M_string_length;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p == paVar1) {
          local_130.field_2._8_4_ = local_110.field_2._8_4_;
          local_130.field_2._12_4_ = local_110.field_2._12_4_;
          local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        }
        else {
          local_130._M_dataplus._M_p = local_110._M_dataplus._M_p;
        }
        local_130.field_2._M_allocated_capacity._4_4_ =
             local_110.field_2._M_allocated_capacity._4_4_;
        local_130.field_2._M_allocated_capacity._0_4_ =
             local_110.field_2._M_allocated_capacity._0_4_;
        local_130._M_string_length = local_110._M_string_length;
        local_110._M_string_length = 0;
        local_110.field_2._M_allocated_capacity._0_4_ =
             local_110.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
        local_110._M_dataplus._M_p = (pointer)paVar1;
        if (sVar3 == 0) {
LAB_002042fb:
          bVar7 = false;
        }
        else {
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"value","");
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"");
          Element::GetAttribute<std::__cxx11::string>(&local_68,element,&local_d0,&local_f0);
          if (local_130._M_string_length != local_68._M_string_length) goto LAB_002042fb;
          if (local_130._M_string_length == 0) {
            bVar7 = true;
          }
          else {
            iVar5 = bcmp(local_130._M_dataplus._M_p,local_68._M_dataplus._M_p,
                         local_130._M_string_length);
            bVar7 = iVar5 == 0;
          }
        }
        if (sVar3 != 0) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != &local_68.field_2) {
            operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
        }
      }
      paVar1 = &local_130.field_2;
      local_130._M_dataplus._M_p = (pointer)paVar1;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"checked","");
      bVar4 = Element::HasAttribute(element,&local_130);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != paVar1) {
        operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
      }
      bVar6 = bVar4 ^ bVar7;
      if (bVar6 == 1) {
        if (bVar7 == 0) {
          local_130._M_dataplus._M_p = (pointer)paVar1;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"checked","");
          Element::RemoveAttribute(element,&local_130);
        }
        else {
          local_130._M_dataplus._M_p = (pointer)paVar1;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"checked","");
          local_b0._M_string_length = 0;
          local_b0.field_2._M_local_buf[0] = '\0';
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          Element::SetAttribute<std::__cxx11::string>(element,&local_130,&local_b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,
                            CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                                     local_b0.field_2._M_local_buf[0]) + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != paVar1) {
          operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
        }
        bVar6 = 1;
      }
      goto LAB_002041d7;
    }
  }
  bVar6 = 0;
LAB_002041d7:
  Variant::~Variant(&local_90);
  return (bool)bVar6;
}

Assistant:

bool DataViewChecked::Update(DataModel& model)
{
	bool result = false;
	Variant variant;
	Element* element = GetElement();
	DataExpressionInterface expr_interface(&model, element);

	if (element && GetExpression().Run(expr_interface, variant))
	{
		bool new_checked_state = false;

		if (variant.GetType() == Variant::BOOL)
		{
			new_checked_state = variant.Get<bool>();
		}
		else
		{
			const String value = variant.Get<String>();
			new_checked_state = (!value.empty() && value == element->GetAttribute<String>("value", ""));
		}

		const bool current_checked_state = element->HasAttribute("checked");

		if (new_checked_state != current_checked_state)
		{
			result = true;
			if (new_checked_state)
				element->SetAttribute("checked", String());
			else
				element->RemoveAttribute("checked");
		}
	}

	return result;
}